

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_block.cpp
# Opt level: O2

void __thiscall
spvtools::val::BasicBlock::RegisterSuccessors
          (BasicBlock *this,
          vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
          *next_blocks)

{
  pointer ppBVar1;
  BasicBlock **block;
  pointer __x;
  BasicBlock *local_38;
  
  ppBVar1 = (next_blocks->
            super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  for (__x = (next_blocks->
             super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
             )._M_impl.super__Vector_impl_data._M_start; __x != ppBVar1; __x = __x + 1) {
    local_38 = this;
    std::vector<spvtools::val::BasicBlock*,std::allocator<spvtools::val::BasicBlock*>>::
    emplace_back<spvtools::val::BasicBlock*>
              ((vector<spvtools::val::BasicBlock*,std::allocator<spvtools::val::BasicBlock*>> *)
               &(*__x)->predecessors_,&local_38);
    std::vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>::
    push_back(&this->successors_,__x);
    local_38 = this;
    std::vector<spvtools::val::BasicBlock*,std::allocator<spvtools::val::BasicBlock*>>::
    emplace_back<spvtools::val::BasicBlock*>
              ((vector<spvtools::val::BasicBlock*,std::allocator<spvtools::val::BasicBlock*>> *)
               &(*__x)->structural_predecessors_,&local_38);
    std::vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>::
    push_back(&this->structural_successors_,__x);
  }
  return;
}

Assistant:

void BasicBlock::RegisterSuccessors(
    const std::vector<BasicBlock*>& next_blocks) {
  for (auto& block : next_blocks) {
    block->predecessors_.push_back(this);
    successors_.push_back(block);

    // Register structural successors/predecessors too.
    block->structural_predecessors_.push_back(this);
    structural_successors_.push_back(block);
  }
}